

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

double Imath_3_2::anon_unknown_20::maxOffDiag<double>(Matrix33<double> *A)

{
  double *pdVar1;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar2;
  double result;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  Matrix33<double> *local_8;
  
  local_10 = 0.0;
  local_8 = in_RDI;
  Matrix33<double>::operator[](in_RDI,0);
  std::abs((int)in_RDI);
  pdVar1 = std::max<double>(&local_10,&local_18);
  local_10 = *pdVar1;
  pMVar2 = local_8;
  Matrix33<double>::operator[](local_8,0);
  std::abs((int)pMVar2);
  pdVar1 = std::max<double>(&local_10,&local_20);
  local_10 = *pdVar1;
  pMVar2 = local_8;
  Matrix33<double>::operator[](local_8,1);
  std::abs((int)pMVar2);
  pdVar1 = std::max<double>(&local_10,&local_28);
  local_10 = *pdVar1;
  pMVar2 = local_8;
  Matrix33<double>::operator[](local_8,1);
  std::abs((int)pMVar2);
  pdVar1 = std::max<double>(&local_10,&local_30);
  local_10 = *pdVar1;
  pMVar2 = local_8;
  Matrix33<double>::operator[](local_8,2);
  std::abs((int)pMVar2);
  pdVar1 = std::max<double>(&local_10,&local_38);
  local_10 = *pdVar1;
  Matrix33<double>::operator[](local_8,2);
  std::abs((int)local_8);
  pdVar1 = std::max<double>(&local_10,&local_40);
  return *pdVar1;
}

Assistant:

IMATH_CONSTEXPR14 T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T result = 0;
    result   = std::max (result, std::abs (A[0][1]));
    result   = std::max (result, std::abs (A[0][2]));
    result   = std::max (result, std::abs (A[1][0]));
    result   = std::max (result, std::abs (A[1][2]));
    result   = std::max (result, std::abs (A[2][0]));
    result   = std::max (result, std::abs (A[2][1]));
    return result;
}